

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::extMul<2ul,int,long,(wasm::LaneOrder)1>
          (Literal *__return_storage_ptr__,wasm *this,Literal *a,Literal *b)

{
  Literal *val;
  long lVar1;
  anon_union_16_6_1532cd5a_for_Literal_0 *this_00;
  undefined1 local_138 [8];
  LaneArray<2UL_*_2> lhs;
  LaneArray<2UL_*_2> rhs;
  LaneArray<2UL> result;
  anon_union_16_6_1532cd5a_for_Literal_0 local_40;
  undefined8 local_30;
  
  getLanes<int,4>((LaneArray<4> *)local_138,this,a);
  getLanes<int,4>((LaneArray<4> *)&lhs._M_elems[3].type,(wasm *)a,val);
  rhs._M_elems[3].type.id = 0;
  lVar1 = 0;
  do {
    if ((*(long *)((long)&lhs._M_elems[2].field_0 + lVar1 + 8) != 2) ||
       (*(long *)((long)&rhs._M_elems[2].field_0 + lVar1 + 8) != 2)) {
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    local_40.i64 = (long)*(int *)((long)&rhs._M_elems[1].type.id + lVar1) *
                   (long)*(int *)((long)&lhs._M_elems[1].type.id + lVar1);
    local_30 = 3;
    this_00 = (anon_union_16_6_1532cd5a_for_Literal_0 *)((long)&rhs._M_elems[3].type.id + lVar1);
    if (this_00 != &local_40) {
      Literal::~Literal((Literal *)&this_00->func);
      Literal::Literal((Literal *)&this_00->func,(Literal *)&local_40.func);
    }
    Literal::~Literal((Literal *)&local_40.func);
    lVar1 = lVar1 + 0x18;
  } while (lVar1 == 0x18);
  Literal::Literal(__return_storage_ptr__,(LaneArray<2> *)&rhs._M_elems[3].type);
  lVar1 = 0x18;
  do {
    Literal::~Literal((Literal *)((long)&rhs._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    Literal::~Literal((Literal *)((long)&lhs._M_elems[3].type.id + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  lVar1 = 0x48;
  do {
    Literal::~Literal((Literal *)(local_138 + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  return __return_storage_ptr__;
}

Assistant:

Literal extMul(const Literal& a, const Literal& b) {
  LaneArray<Lanes* 2> lhs = getLanes<LaneFrom, Lanes * 2>(a);
  LaneArray<Lanes* 2> rhs = getLanes<LaneFrom, Lanes * 2>(b);
  LaneArray<Lanes> result;
  for (size_t i = 0; i < Lanes; ++i) {
    size_t idx = (Side == LaneOrder::Low) ? i : i + Lanes;
    result[i] = Literal((LaneTo)(LaneFrom)lhs[idx].geti32() *
                        (LaneTo)(LaneFrom)rhs[idx].geti32());
  }
  return Literal(result);
}